

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

interval_t
duckdb::TryCastCInternal<duckdb::interval_t,duckdb::interval_t,duckdb::TryCast>
          (duckdb_result *result,idx_t col,idx_t row)

{
  void *pvVar1;
  bool bVar2;
  interval_t input;
  interval_t result_value;
  interval_t local_20;
  
  pvVar1 = result->deprecated_columns[col].deprecated_data;
  input.micros = *(int64_t *)((long)pvVar1 + row * 0x10 + 8);
  input._0_8_ = *(undefined8 *)((long)pvVar1 + row * 0x10);
  bVar2 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>(input,&local_20,false);
  if (!bVar2) {
    local_20 = FetchDefaultValue::Operation<duckdb::interval_t>();
  }
  return local_20;
}

Assistant:

void *UnsafeFetchPtr(duckdb_result *result, idx_t col, idx_t row) {
	D_ASSERT(row < result->deprecated_row_count);
	return (void *)&(((T *)result->deprecated_columns[col].deprecated_data)[row]);
}